

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerQueue.cpp
# Opt level: O1

void __thiscall Liby::TimerQueue::start(TimerQueue *this)

{
  Channel *pCVar1;
  _Any_data local_28;
  code *local_18;
  code *pcStack_10;
  
  pCVar1 = (this->timerChan_)._M_t.
           super___uniq_ptr_impl<Liby::Channel,_std::default_delete<Liby::Channel>_>._M_t.
           super__Tuple_impl<0UL,_Liby::Channel_*,_std::default_delete<Liby::Channel>_>.
           super__Head_base<0UL,_Liby::Channel_*,_false>._M_head_impl;
  pCVar1->readable_ = true;
  local_28._8_8_ = 0;
  pcStack_10 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/TimerQueue.cpp:55:24)>
               ::_M_invoke;
  local_18 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/TimerQueue.cpp:55:24)>
             ::_M_manager;
  local_28._M_unused._M_object = this;
  std::function<void_()>::operator=(&pCVar1->erroEventCallback_,(function<void_()> *)&local_28);
  if (local_18 != (code *)0x0) {
    (*local_18)(&local_28,&local_28,__destroy_functor);
  }
  local_28._8_8_ = 0;
  pcStack_10 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/TimerQueue.cpp:56:24)>
               ::_M_invoke;
  local_18 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/TimerQueue.cpp:56:24)>
             ::_M_manager;
  local_28._M_unused._M_object = this;
  std::function<void_()>::operator=
            (&((this->timerChan_)._M_t.
               super___uniq_ptr_impl<Liby::Channel,_std::default_delete<Liby::Channel>_>._M_t.
               super__Tuple_impl<0UL,_Liby::Channel_*,_std::default_delete<Liby::Channel>_>.
               super__Head_base<0UL,_Liby::Channel_*,_false>._M_head_impl)->readEventCallback_,
             (function<void_()> *)&local_28);
  if (local_18 != (code *)0x0) {
    (*local_18)(&local_28,&local_28,__destroy_functor);
  }
  Channel::addChannel((this->timerChan_)._M_t.
                      super___uniq_ptr_impl<Liby::Channel,_std::default_delete<Liby::Channel>_>._M_t
                      .super__Tuple_impl<0UL,_Liby::Channel_*,_std::default_delete<Liby::Channel>_>.
                      super__Head_base<0UL,_Liby::Channel_*,_false>._M_head_impl);
  return;
}

Assistant:

void TimerQueue::start() {
#ifdef __linux__
    timerChan_->enableRead();
    timerChan_->onErro([this] { destroy(); });
    timerChan_->onRead([this] {
        if (timerfd_ < 0) {
            error("timerfd < 0");
        }

        uint64_t n;
        while (1) {
            int ret = ::read(timerfd_, &n, sizeof(n));
            if (ret <= 0)
                break;
        }

        handleTimeoutEvents();
    });
    timerChan_->addChannel();
#endif
}